

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-core.c
# Opt level: O2

wchar_t cmd_get_arg_point(command_conflict *cmd,char *arg,loc *grid)

{
  wchar_t wVar1;
  cmd_arg_data_conflict data;
  
  wVar1 = cmd_get_arg(cmd,arg,arg_POINT,&data);
  if (wVar1 == L'\0') {
    *grid = (loc)data;
  }
  return wVar1;
}

Assistant:

int cmd_get_arg_point(struct command *cmd, const char *arg, struct loc *grid)
{
	union cmd_arg_data data;
	int err;

	if ((err = cmd_get_arg(cmd, arg, arg_POINT, &data)) == CMD_OK) {
		*grid = data.point;
	}

	return err;
}